

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool gl4cts::GLSL420Pack::Utils::checkUniformArrayBinding
               (program *program,GLchar *name,GLuint index,GLint expected_binding)

{
  GLuint location;
  GLint GVar1;
  TestError *this;
  GLint binding;
  char local_68 [4];
  GLint uniform_location;
  GLchar buffer [64];
  GLint expected_binding_local;
  GLuint index_local;
  GLchar *name_local;
  program *program_local;
  
  sprintf(local_68,"%s[%d]",name,(ulong)index);
  location = Utils::program::getUniformLocation(program,local_68);
  if (location == 0xffffffff) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Uniform is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x5b);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar1 = Utils::program::getUniform1i(program,location);
  return expected_binding == GVar1;
}

Assistant:

bool Utils::checkUniformArrayBinding(Utils::program& program, const glw::GLchar* name, glw::GLuint index,
									 glw::GLint expected_binding)
{
	GLchar buffer[64];
	sprintf(buffer, "%s[%d]", name, index);

	const GLint uniform_location = program.getUniformLocation(buffer);
	if (-1 == uniform_location)
	{
		TCU_FAIL("Uniform is inactive");
	}

	GLint binding = program.getUniform1i(uniform_location);

	return (expected_binding == binding);
}